

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Scale_x86::forward_inplace
          (Scale_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,
          Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  void *pvVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  uint uVar14;
  reference pvVar15;
  reference pvVar16;
  int iVar17;
  undefined8 *puVar18;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  __m128 _p_8;
  __m128 _s128_1;
  int j_5;
  float s_3;
  float *ptr_8;
  int i_9;
  __m128 _p_7;
  __m128 _bias128;
  __m128 _s128;
  int j_4;
  float s_2;
  float *ptr_7;
  int i_8;
  int size_3;
  __m128 _p_6;
  __m128 _s_6;
  int j_3;
  float s_1;
  float *ptr_6;
  int i_7;
  __m128 _p_5;
  __m128 _bias_3;
  __m128 _s_5;
  int j_2;
  float bias_1;
  float s;
  float *ptr_5;
  int i_6;
  int size_2;
  __m128 _p_4;
  int i_5;
  __m128 _s_4;
  float *ptr_4;
  int q_1;
  __m128 _p_3;
  int i_4;
  __m128 _bias_2;
  __m128 _s_3;
  float *ptr_3;
  int q;
  int size_1;
  __m128 _p_2;
  int j_1;
  __m128 _s_2;
  float *ptr_2;
  int i_3;
  __m128 _p_1;
  int j;
  __m128 _bias_1;
  __m128 _s_1;
  float *ptr_1;
  int i_2;
  int i_1;
  __m128 _bias;
  __m128 _s;
  __m128 _p;
  int i;
  int nn;
  int remain;
  int size;
  float *ptr;
  float *bias;
  float *scale;
  int elempack;
  int dims;
  int channels;
  int h;
  int w;
  Mat *scale_blob;
  Mat *bottom_top_blob;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  int local_cd8;
  float *local_c88;
  int local_c7c;
  undefined8 local_c78;
  undefined8 uStack_c70;
  int local_c48;
  float *local_bf8;
  int local_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  int local_bc0;
  float *local_bb8;
  int local_bac;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  int local_b74;
  float *local_b68;
  int local_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  int local_b3c;
  undefined8 *local_ad8;
  int local_acc;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  int local_aac;
  undefined8 *local_a28;
  int local_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  int local_9fc;
  undefined8 *local_9e8;
  int local_9dc;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  int local_9bc;
  undefined8 *local_998;
  int local_990;
  int local_98c;
  undefined8 local_968;
  undefined8 uStack_960;
  int local_958;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float local_768;
  float fStack_764;
  float fStack_760;
  float fStack_75c;
  float local_748;
  float fStack_744;
  float fStack_740;
  float fStack_73c;
  float local_728;
  float fStack_724;
  float fStack_720;
  float fStack_71c;
  float local_708;
  float fStack_704;
  float fStack_700;
  float fStack_6fc;
  float local_6e8;
  float fStack_6e4;
  float fStack_6e0;
  float fStack_6dc;
  float local_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float local_6c8;
  float fStack_6c4;
  float fStack_6c0;
  float fStack_6bc;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float local_688;
  float fStack_684;
  float fStack_680;
  float fStack_67c;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  
  pvVar15 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  pvVar16 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar17 = pvVar15->w;
  iVar3 = pvVar15->h;
  iVar4 = pvVar15->c;
  iVar5 = pvVar15->dims;
  iVar6 = pvVar15->elempack;
  pvVar7 = pvVar16->data;
  lVar8 = *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120);
  if (iVar5 == 1) {
    pvVar9 = pvVar15->data;
    uVar14 = iVar17 * iVar6;
    for (local_958 = 0; local_958 < (int)uVar14 >> 2; local_958 = local_958 + 1) {
      puVar18 = (undefined8 *)((long)pvVar9 + (long)(local_958 << 2) * 4);
      uVar10 = *puVar18;
      uVar11 = puVar18[1];
      puVar18 = (undefined8 *)((long)pvVar7 + (long)(local_958 << 2) * 4);
      uVar12 = *puVar18;
      uVar13 = puVar18[1];
      local_768 = (float)uVar10;
      fStack_764 = (float)((ulong)uVar10 >> 0x20);
      fStack_760 = (float)uVar11;
      fStack_75c = (float)((ulong)uVar11 >> 0x20);
      local_778 = (float)uVar12;
      fStack_774 = (float)((ulong)uVar12 >> 0x20);
      fStack_770 = (float)uVar13;
      fStack_76c = (float)((ulong)uVar13 >> 0x20);
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        local_968 = CONCAT44(fStack_764 * fStack_774,local_768 * local_778);
        uStack_960 = CONCAT44(fStack_75c * fStack_76c,fStack_760 * fStack_770);
      }
      else {
        puVar18 = (undefined8 *)(lVar8 + (long)(local_958 << 2) * 4);
        uVar10 = *puVar18;
        uVar11 = puVar18[1];
        local_4d8 = (float)uVar10;
        fStack_4d4 = (float)((ulong)uVar10 >> 0x20);
        fStack_4d0 = (float)uVar11;
        fStack_4cc = (float)((ulong)uVar11 >> 0x20);
        local_968 = CONCAT44(fStack_764 * fStack_774 + fStack_4d4,local_768 * local_778 + local_4d8)
        ;
        uStack_960 = CONCAT44(fStack_75c * fStack_76c + fStack_4cc,
                              fStack_760 * fStack_770 + fStack_4d0);
      }
      puVar18 = (undefined8 *)((long)pvVar9 + (long)(local_958 << 2) * 4);
      *puVar18 = local_968;
      puVar18[1] = uStack_960;
    }
    for (local_98c = uVar14 - (uVar14 & 3); local_98c < (int)uVar14; local_98c = local_98c + 1) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        *(float *)((long)pvVar9 + (long)local_98c * 4) =
             *(float *)((long)pvVar9 + (long)local_98c * 4) *
             *(float *)((long)pvVar7 + (long)local_98c * 4);
      }
      else {
        *(float *)((long)pvVar9 + (long)local_98c * 4) =
             *(float *)((long)pvVar9 + (long)local_98c * 4) *
             *(float *)((long)pvVar7 + (long)local_98c * 4) +
             *(float *)(lVar8 + (long)local_98c * 4);
      }
    }
  }
  else {
    if (iVar6 == 4) {
      if (iVar5 == 2) {
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
          for (local_9dc = 0; local_9dc < iVar3; local_9dc = local_9dc + 1) {
            local_9e8 = (undefined8 *)
                        ((long)pvVar15->data +
                        (long)pvVar15->w * (long)local_9dc * pvVar15->elemsize);
            puVar18 = (undefined8 *)((long)pvVar16->data + (long)(local_9dc << 2) * 4);
            uVar10 = *puVar18;
            uVar11 = puVar18[1];
            for (local_9fc = 0; local_9fc < iVar17; local_9fc = local_9fc + 1) {
              local_688 = (float)*local_9e8;
              fStack_684 = (float)((ulong)*local_9e8 >> 0x20);
              fStack_680 = (float)local_9e8[1];
              fStack_67c = (float)((ulong)local_9e8[1] >> 0x20);
              local_698 = (float)uVar10;
              fStack_694 = (float)((ulong)uVar10 >> 0x20);
              fStack_690 = (float)uVar11;
              fStack_68c = (float)((ulong)uVar11 >> 0x20);
              local_a18 = CONCAT44(fStack_684 * fStack_694,local_688 * local_698);
              uStack_a10 = CONCAT44(fStack_67c * fStack_68c,fStack_680 * fStack_690);
              *local_9e8 = local_a18;
              local_9e8[1] = uStack_a10;
              local_9e8 = local_9e8 + 2;
            }
          }
        }
        else {
          for (local_990 = 0; local_990 < iVar3; local_990 = local_990 + 1) {
            local_998 = (undefined8 *)
                        ((long)pvVar15->data +
                        (long)pvVar15->w * (long)local_990 * pvVar15->elemsize);
            puVar18 = (undefined8 *)((long)pvVar16->data + (long)(local_990 << 2) * 4);
            uVar10 = *puVar18;
            uVar11 = puVar18[1];
            puVar18 = (undefined8 *)
                      (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                      (long)(local_990 << 2) * 4);
            uVar12 = *puVar18;
            uVar13 = puVar18[1];
            for (local_9bc = 0; local_9bc < iVar17; local_9bc = local_9bc + 1) {
              local_668 = (float)*local_998;
              fStack_664 = (float)((ulong)*local_998 >> 0x20);
              fStack_660 = (float)local_998[1];
              fStack_65c = (float)((ulong)local_998[1] >> 0x20);
              local_678 = (float)uVar10;
              fStack_674 = (float)((ulong)uVar10 >> 0x20);
              fStack_670 = (float)uVar11;
              fStack_66c = (float)((ulong)uVar11 >> 0x20);
              local_458 = (float)uVar12;
              fStack_454 = (float)((ulong)uVar12 >> 0x20);
              fStack_450 = (float)uVar13;
              fStack_44c = (float)((ulong)uVar13 >> 0x20);
              local_9d8 = CONCAT44(fStack_664 * fStack_674 + fStack_454,
                                   local_668 * local_678 + local_458);
              uStack_9d0 = CONCAT44(fStack_65c * fStack_66c + fStack_44c,
                                    fStack_660 * fStack_670 + fStack_450);
              *local_998 = local_9d8;
              local_998[1] = uStack_9d0;
              local_998 = local_998 + 2;
            }
          }
        }
      }
      if (iVar5 == 3) {
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
          for (local_acc = 0; local_acc < iVar4; local_acc = local_acc + 1) {
            local_ad8 = (undefined8 *)
                        ((long)pvVar15->data + pvVar15->cstep * (long)local_acc * pvVar15->elemsize)
            ;
            puVar18 = (undefined8 *)((long)pvVar16->data + (long)(local_acc << 2) * 4);
            uVar10 = *puVar18;
            uVar11 = puVar18[1];
            for (local_b3c = 0; local_b3c < iVar17 * iVar3; local_b3c = local_b3c + 1) {
              local_6c8 = (float)*local_ad8;
              fStack_6c4 = (float)((ulong)*local_ad8 >> 0x20);
              fStack_6c0 = (float)local_ad8[1];
              fStack_6bc = (float)((ulong)local_ad8[1] >> 0x20);
              local_6d8 = (float)uVar10;
              fStack_6d4 = (float)((ulong)uVar10 >> 0x20);
              fStack_6d0 = (float)uVar11;
              fStack_6cc = (float)((ulong)uVar11 >> 0x20);
              local_b58 = CONCAT44(fStack_6c4 * fStack_6d4,local_6c8 * local_6d8);
              uStack_b50 = CONCAT44(fStack_6bc * fStack_6cc,fStack_6c0 * fStack_6d0);
              *local_ad8 = local_b58;
              local_ad8[1] = uStack_b50;
              local_ad8 = local_ad8 + 2;
            }
          }
        }
        else {
          for (local_a20 = 0; local_a20 < iVar4; local_a20 = local_a20 + 1) {
            local_a28 = (undefined8 *)
                        ((long)pvVar15->data + pvVar15->cstep * (long)local_a20 * pvVar15->elemsize)
            ;
            puVar18 = (undefined8 *)((long)pvVar16->data + (long)(local_a20 << 2) * 4);
            uVar10 = *puVar18;
            uVar11 = puVar18[1];
            puVar18 = (undefined8 *)
                      (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                      (long)(local_a20 << 2) * 4);
            uVar12 = *puVar18;
            uVar13 = puVar18[1];
            for (local_aac = 0; local_aac < iVar17 * iVar3; local_aac = local_aac + 1) {
              local_6a8 = (float)*local_a28;
              fStack_6a4 = (float)((ulong)*local_a28 >> 0x20);
              fStack_6a0 = (float)local_a28[1];
              fStack_69c = (float)((ulong)local_a28[1] >> 0x20);
              local_6b8 = (float)uVar10;
              fStack_6b4 = (float)((ulong)uVar10 >> 0x20);
              fStack_6b0 = (float)uVar11;
              fStack_6ac = (float)((ulong)uVar11 >> 0x20);
              local_478 = (float)uVar12;
              fStack_474 = (float)((ulong)uVar12 >> 0x20);
              fStack_470 = (float)uVar13;
              fStack_46c = (float)((ulong)uVar13 >> 0x20);
              local_ac8 = CONCAT44(fStack_6a4 * fStack_6b4 + fStack_474,
                                   local_6a8 * local_6b8 + local_478);
              uStack_ac0 = CONCAT44(fStack_69c * fStack_6ac + fStack_46c,
                                    fStack_6a0 * fStack_6b0 + fStack_470);
              *local_a28 = local_ac8;
              local_a28[1] = uStack_ac0;
              local_a28 = local_a28 + 2;
            }
          }
        }
      }
    }
    if (iVar6 == 1) {
      if (iVar5 == 2) {
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
          for (local_bac = 0; local_bac < iVar3; local_bac = local_bac + 1) {
            local_bb8 = (float *)((long)pvVar15->data +
                                 (long)pvVar15->w * (long)local_bac * pvVar15->elemsize);
            fVar1 = *(float *)((long)pvVar16->data + (long)local_bac * 4);
            for (local_bc0 = 0; local_bc0 + 3 < iVar17; local_bc0 = local_bc0 + 4) {
              local_6e8 = (float)*(undefined8 *)local_bb8;
              fStack_6e4 = (float)((ulong)*(undefined8 *)local_bb8 >> 0x20);
              fStack_6e0 = (float)*(undefined8 *)(local_bb8 + 2);
              fStack_6dc = (float)((ulong)*(undefined8 *)(local_bb8 + 2) >> 0x20);
              local_be8 = CONCAT44(fStack_6e4 * fVar1,local_6e8 * fVar1);
              uStack_be0 = CONCAT44(fStack_6dc * fVar1,fStack_6e0 * fVar1);
              *(undefined8 *)local_bb8 = local_be8;
              *(undefined8 *)(local_bb8 + 2) = uStack_be0;
              local_bb8 = local_bb8 + 4;
            }
            for (; local_bc0 < iVar17; local_bc0 = local_bc0 + 1) {
              *local_bb8 = fVar1 * *local_bb8;
              local_bb8 = local_bb8 + 1;
            }
          }
        }
        else {
          for (local_b60 = 0; local_b60 < iVar3; local_b60 = local_b60 + 1) {
            local_b68 = (float *)((long)pvVar15->data +
                                 (long)pvVar15->w * (long)local_b60 * pvVar15->elemsize);
            fVar1 = *(float *)((long)pvVar16->data + (long)local_b60 * 4);
            fVar2 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                              (long)local_b60 * 4);
            for (local_b74 = 0; local_b74 + 3 < iVar17; local_b74 = local_b74 + 4) {
              local_748 = (float)*(undefined8 *)local_b68;
              fStack_744 = (float)((ulong)*(undefined8 *)local_b68 >> 0x20);
              fStack_740 = (float)*(undefined8 *)(local_b68 + 2);
              fStack_73c = (float)((ulong)*(undefined8 *)(local_b68 + 2) >> 0x20);
              local_ba8 = CONCAT44(fStack_744 * fVar1 + fVar2,local_748 * fVar1 + fVar2);
              uStack_ba0 = CONCAT44(fStack_73c * fVar1 + fVar2,fStack_740 * fVar1 + fVar2);
              *(undefined8 *)local_b68 = local_ba8;
              *(undefined8 *)(local_b68 + 2) = uStack_ba0;
              local_b68 = local_b68 + 4;
            }
            for (; local_b74 < iVar17; local_b74 = local_b74 + 1) {
              *local_b68 = *local_b68 * fVar1 + fVar2;
              local_b68 = local_b68 + 1;
            }
          }
        }
      }
      if (iVar5 == 3) {
        iVar17 = iVar17 * iVar3;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
          for (local_c7c = 0; local_c7c < iVar4; local_c7c = local_c7c + 1) {
            local_c88 = (float *)((long)pvVar15->data +
                                 pvVar15->cstep * (long)local_c7c * pvVar15->elemsize);
            fVar1 = *(float *)((long)pvVar16->data + (long)local_c7c * 4);
            for (local_cd8 = 0; local_cd8 < iVar17; local_cd8 = local_cd8 + 4) {
              local_708 = (float)*(undefined8 *)local_c88;
              fStack_704 = (float)((ulong)*(undefined8 *)local_c88 >> 0x20);
              fStack_700 = (float)*(undefined8 *)(local_c88 + 2);
              fStack_6fc = (float)((ulong)*(undefined8 *)(local_c88 + 2) >> 0x20);
              local_cf8 = CONCAT44(fStack_704 * fVar1,local_708 * fVar1);
              uStack_cf0 = CONCAT44(fStack_6fc * fVar1,fStack_700 * fVar1);
              *(undefined8 *)local_c88 = local_cf8;
              *(undefined8 *)(local_c88 + 2) = uStack_cf0;
              local_c88 = local_c88 + 4;
            }
            for (; local_cd8 < iVar17; local_cd8 = local_cd8 + 1) {
              *local_c88 = fVar1 * *local_c88;
              local_c88 = local_c88 + 1;
            }
          }
        }
        else {
          for (local_bf0 = 0; local_bf0 < iVar4; local_bf0 = local_bf0 + 1) {
            local_bf8 = (float *)((long)pvVar15->data +
                                 pvVar15->cstep * (long)local_bf0 * pvVar15->elemsize);
            fVar1 = *(float *)((long)pvVar16->data + (long)local_bf0 * 4);
            local_c48 = 0;
            fVar2 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                              (long)local_bf0 * 4);
            for (; local_c48 < iVar17; local_c48 = local_c48 + 4) {
              local_728 = (float)*(undefined8 *)local_bf8;
              fStack_724 = (float)((ulong)*(undefined8 *)local_bf8 >> 0x20);
              fStack_720 = (float)*(undefined8 *)(local_bf8 + 2);
              fStack_71c = (float)((ulong)*(undefined8 *)(local_bf8 + 2) >> 0x20);
              local_c78 = CONCAT44(fStack_724 * fVar1 + fVar2,local_728 * fVar1 + fVar2);
              uStack_c70 = CONCAT44(fStack_71c * fVar1 + fVar2,fStack_720 * fVar1 + fVar2);
              *(undefined8 *)local_bf8 = local_c78;
              *(undefined8 *)(local_bf8 + 2) = uStack_c70;
              local_bf8 = local_bf8 + 4;
            }
            for (; local_c48 < iVar17; local_c48 = local_c48 + 1) {
              *local_bf8 = *local_bf8 * fVar1 +
                           *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                                     (long)local_bf0 * 4);
              local_bf8 = local_bf8 + 1;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Scale_x86::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    Mat& bottom_top_blob = bottom_top_blobs[0];
    const Mat& scale_blob = bottom_top_blobs[1];

    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int channels = bottom_top_blob.c;
    const int dims = bottom_top_blob.dims;

    const int elempack = bottom_top_blob.elempack;

    const float* scale = scale_blob;
    const float* bias = bias_data;

    if (dims == 1)
    {
        float* ptr = (float*)bottom_top_blob;
        int size = w * elempack;

        int remain = size;
#if __SSE2__
#if __AVX__
        int nn = size >> 3;
        remain = size & 7;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < nn; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr + i * 8);
            __m256 _s = _mm256_loadu_ps(scale + i * 8);
            if (bias_term)
            {
                __m256 _bias = _mm256_loadu_ps(bias + i * 8);
                _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
            }
            else
            {
                _p = _mm256_mul_ps(_p, _s);
            }
            _mm256_storeu_ps(ptr + i * 8, _p);
        }
#else
        int nn = size >> 2;
        remain = size & 3;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < nn; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr + i * 4);
            __m128 _s = _mm_loadu_ps(scale + i * 4);
            if (bias_term)
            {
                __m128 _bias = _mm_loadu_ps(bias + i * 4);
                _p = _mm_comp_fmadd_ps(_p, _s, _bias);
            }
            else
            {
                _p = _mm_mul_ps(_p, _s);
            }
            _mm_storeu_ps(ptr + i * 4, _p);
        }
#endif // __AVX__
#endif // __SSE2__
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = size - remain; i < size; i++)
        {
            if (bias_term)
            {
                ptr[i] = ptr[i] * scale[i] + bias[i];
            }
            else
            {
                ptr[i] = ptr[i] * scale[i];
            }
        }

        return 0;
    }

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 2)
        {
            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }
        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 2)
        {
            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1)
    {
        if (dims == 2)
        {
            int size = w;
            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);

                    float s = scale_blob[i];
                    float bias = bias_data[i];

                    int j = 0;
#if __SSE2__
#if __AVX__
                    __m256 _s = _mm256_set1_ps(s);
                    __m256 _bias = _mm256_set1_ps(bias);

                    for (; j + 7 < size; j += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
#else
                    __m128 _s = _mm_set1_ps(s);
                    __m128 _bias = _mm_set1_ps(bias);

                    for (; j + 3 < size; j += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _s, _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
#endif // __AVX__
#endif // __SSE2__

                    for (; j < size; j++)
                    {
                        *ptr = *ptr * s + bias;

                        ptr++;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);

                    float s = scale_blob[i];

                    int j = 0;
#if __SSE2__
#if __AVX__
                    __m256 _s = _mm256_set1_ps(s);

                    for (; j + 7 < size; j += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
#else
                    __m128 _s = _mm_set1_ps(s);

                    for (; j + 3 < size; j += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
#endif // __AVX__
#endif // __SSE2__

                    for (; j < size; j++)
                    {
                        *ptr *= s;

                        ptr++;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int size = w * h;
            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < channels; i++)
                {
                    float* ptr = bottom_top_blob.channel(i);

                    float s = scale_blob[i];

                    int j = 0;
#if __SSE2__
#if __AVX__
                    __m256 _s256 = _mm256_set1_ps(s);
                    __m256 _bias256 = _mm256_set1_ps(bias_data[i]);
                    for (; j + 7 < size; j += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s256, _bias256);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _s128 = _mm_set1_ps(s);
                    __m128 _bias128 = _mm_set1_ps(bias_data[i]);
                    for (; j < size; j += 4)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _s128, _bias128);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
#endif // __SSE2__

                    for (; j < size; j++)
                    {
                        *ptr = *ptr * s + bias_data[i];
                        ptr++;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < channels; i++)
                {
                    float* ptr = bottom_top_blob.channel(i);

                    float s = scale_blob[i];

                    int j = 0;
#if __SSE2__
#if __AVX__
                    __m256 _s256 = _mm256_set1_ps(s);
                    for (; j + 7 < size; j += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s256);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
#endif // __AVX__

                    __m128 _s128 = _mm_set1_ps(s);
                    for (; j < size; j += 4)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        _p = _mm_mul_ps(_p, _s128);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
#endif // __SSE2__

                    for (; j < size; j++)
                    {
                        *ptr *= s;
                        ptr++;
                    }
                }
            }
        }
    }

    return 0;
}